

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintPlacement(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Plc_t GVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    uVar1 = p->nObjs;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 0;
    uVar6 = 0;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      GVar2 = p->pPlacement[uVar4];
      uVar3 = (ulong)((int)uVar3 + ((uint)GVar2 & 1));
      uVar6 = (ulong)((int)uVar6 + (uint)(((uint)GVar2 >> 0x10 & 1) != 0));
    }
    Abc_Print((int)uVar5,"Placement:  Objects = %8d.  Fixed = %8d.  Undef = %8d.\n",(ulong)uVar1,
              uVar3,uVar6);
    return;
  }
  return;
}

Assistant:

void Gia_ManPrintPlacement( Gia_Man_t * p )
{
    int i, nFixed = 0, nUndef = 0;
    if ( p->pPlacement == NULL )
        return;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        nFixed += p->pPlacement[i].fFixed;
        nUndef += p->pPlacement[i].fUndef;
    }
    Abc_Print( 1, "Placement:  Objects = %8d.  Fixed = %8d.  Undef = %8d.\n", Gia_ManObjNum(p), nFixed, nUndef );
}